

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddExport.c
# Opt level: O0

int Cudd_DumpDaVinci(DdManager *dd,int n,DdNode **f,char **inames,char **onames,FILE *fp)

{
  int iVar1;
  st__generator *gen_00;
  char *pcVar2;
  ulong local_80;
  ptruint mask;
  ptruint diff;
  ptruint refAddr;
  st__generator *gen;
  int i;
  int retval;
  st__table *visited;
  DdNode *scan;
  DdNode *support;
  FILE *fp_local;
  char **onames_local;
  char **inames_local;
  DdNode **f_local;
  DdManager *pDStack_18;
  int n_local;
  DdManager *dd_local;
  
  scan = (DdNode *)0x0;
  support = (DdNode *)fp;
  fp_local = (FILE *)onames;
  onames_local = inames;
  inames_local = (char **)f;
  f_local._4_4_ = n;
  pDStack_18 = dd;
  _i = st__init_table(st__ptrcmp,st__ptrhash);
  if (_i != (st__table *)0x0) {
    for (gen._0_4_ = 0; (int)(uint)gen < f_local._4_4_; gen._0_4_ = (uint)gen + 1) {
      iVar1 = cuddCollectNodes((DdNode *)((ulong)inames_local[(int)(uint)gen] & 0xfffffffffffffffe),
                               _i);
      if (iVar1 == 0) goto LAB_00bff21b;
    }
    pcVar2 = *inames_local;
    mask = 0;
    gen_00 = st__init_gen(_i);
    while (iVar1 = st__gen(gen_00,(char **)&visited,(char **)0x0), iVar1 != 0) {
      mask = (ulong)pcVar2 & 0xfffffffffffffffe ^ (ulong)visited | mask;
    }
    st__free_gen(gen_00);
    gen._0_4_ = 0;
    while (((uint)gen < 0x40 &&
           (local_80 = (ulong)((1 << ((byte)(uint)gen & 0x1f)) + -1), local_80 < mask))) {
      gen._0_4_ = (uint)gen + 4;
    }
    st__free_table(_i);
    _i = st__init_table(st__ptrcmp,st__ptrhash);
    if ((_i != (st__table *)0x0) && (iVar1 = fprintf((FILE *)support,"["), iVar1 != -1)) {
      for (gen._0_4_ = 0; (int)(uint)gen < f_local._4_4_; gen._0_4_ = (uint)gen + 1) {
        if (fp_local == (FILE *)0x0) {
          gen._4_4_ = fprintf((FILE *)support,"l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                              (ulong)(uint)gen,(ulong)(uint)gen);
        }
        else {
          gen._4_4_ = fprintf((FILE *)support,"l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",
                              *(undefined8 *)(&fp_local->_flags + (long)(int)(uint)gen * 2),
                              *(undefined8 *)(&fp_local->_flags + (long)(int)(uint)gen * 2));
        }
        if (gen._4_4_ == -1) goto LAB_00bff21b;
        pcVar2 = "blue";
        if (((ulong)inames_local[(int)(uint)gen] & 1) != 0) {
          pcVar2 = "red";
        }
        iVar1 = fprintf((FILE *)support,
                        "[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],",pcVar2);
        if ((iVar1 == -1) ||
           (iVar1 = ddDoDumpDaVinci(pDStack_18,
                                    (DdNode *)
                                    ((ulong)inames_local[(int)(uint)gen] & 0xfffffffffffffffe),
                                    (FILE *)support,_i,onames_local,local_80), iVar1 == 0))
        goto LAB_00bff21b;
        pcVar2 = ",";
        if ((uint)gen == f_local._4_4_ - 1U) {
          pcVar2 = "";
        }
        iVar1 = fprintf((FILE *)support,")]))%s",pcVar2);
        if (iVar1 == -1) goto LAB_00bff21b;
      }
      iVar1 = fprintf((FILE *)support,"]\n");
      if (iVar1 != -1) {
        st__free_table(_i);
        return 1;
      }
    }
  }
LAB_00bff21b:
  if (scan != (DdNode *)0x0) {
    Cudd_RecursiveDeref(pDStack_18,scan);
  }
  if (_i != (st__table *)0x0) {
    st__free_table(_i);
  }
  return 0;
}

Assistant:

int
Cudd_DumpDaVinci(
  DdManager * dd /* manager */,
  int  n /* number of output nodes to be dumped */,
  DdNode ** f /* array of output nodes to be dumped */,
  char ** inames /* array of input names (or NULL) */,
  char ** onames /* array of output names (or NULL) */,
  FILE * fp /* pointer to the dump file */)
{
    DdNode        *support = NULL;
    DdNode        *scan;
    st__table      *visited = NULL;
    int           retval;
    int           i;
    st__generator  *gen;
    ptruint       refAddr, diff, mask;

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    /* Collect all the nodes of this DD in the symbol table. */
    for (i = 0; i < n; i++) {
        retval = cuddCollectNodes(Cudd_Regular(f[i]),visited);
        if (retval == 0) goto failure;
    }

    /* Find how many most significant hex digits are identical
    ** in the addresses of all the nodes. Build a mask based
    ** on this knowledge, so that digits that carry no information
    ** will not be printed. This is done in two steps.
    **  1. We scan the symbol table to find the bits that differ
    **     in at least 2 addresses.
    **  2. We choose one of the possible masks. There are 8 possible
    **     masks for 32-bit integer, and 16 possible masks for 64-bit
    **     integers.
    */

    /* Find the bits that are different. */
    refAddr = (ptruint) Cudd_Regular(f[0]);
    diff = 0;
    gen = st__init_gen(visited);
    while ( st__gen(gen, (const char **)&scan, NULL)) {
        diff |= refAddr ^ (ptruint) scan;
    }
    st__free_gen(gen);

    /* Choose the mask. */
    for (i = 0; (unsigned) i < 8 * sizeof(ptruint); i += 4) {
        mask = (1 << i) - 1;
        if (diff <= mask) break;
    }
    st__free_table(visited);

    /* Initialize symbol table for visited nodes. */
    visited = st__init_table( st__ptrcmp, st__ptrhash);
    if (visited == NULL) goto failure;

    retval = fprintf(fp, "[");
    if (retval == EOF) goto failure;
    /* Call the function that really gets the job done. */
    for (i = 0; i < n; i++) {
        if (onames == NULL) {
            retval = fprintf(fp,
                             "l(\"f%d\",n(\"root\",[a(\"OBJECT\",\"f%d\")],",
                             i,i);
        } else {
            retval = fprintf(fp,
                             "l(\"%s\",n(\"root\",[a(\"OBJECT\",\"%s\")],",
                             onames[i], onames[i]);
        }
        if (retval == EOF) goto failure;
        retval = fprintf(fp, "[e(\"edge\",[a(\"EDGECOLOR\",\"%s\"),a(\"_DIR\",\"none\")],",
                         Cudd_IsComplement(f[i]) ? "red" : "blue");
        if (retval == EOF) goto failure;
        retval = ddDoDumpDaVinci(dd,Cudd_Regular(f[i]),fp,visited,inames,mask);
        if (retval == 0) goto failure;
        retval = fprintf(fp, ")]))%s", i == n-1 ? "" : ",");
        if (retval == EOF) goto failure;
    }

    /* Write trailer and return. */
    retval = fprintf(fp, "]\n");
    if (retval == EOF) goto failure;

    st__free_table(visited);
    return(1);

failure:
    if (support != NULL) Cudd_RecursiveDeref(dd,support);
    if (visited != NULL) st__free_table(visited);
    return(0);

}